

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::kotlin::FieldGenerator::GenerateEnumField
          (FieldGenerator *this,Printer *printer)

{
  Printer *printer_00;
  FieldDescriptor *pFVar1;
  initializer_list<google::protobuf::io::Printer::Sub> v;
  initializer_list<google::protobuf::io::Printer::Sub> v_00;
  initializer_list<google::protobuf::io::Printer::Sub> v_01;
  undefined8 this_00;
  bool bVar2;
  EnumDescriptor *descriptor;
  Options *pOVar3;
  undefined1 kdoc;
  undefined8 in_R8;
  Sub *local_7f0;
  Sub *local_7b0;
  Sub *local_720;
  string_view local_6f0;
  Options local_6e0;
  string_view local_690;
  Options local_680;
  basic_string_view<char,_std::char_traits<char>_> local_628;
  undefined1 local_611;
  anon_class_8_1_55a613f1_for_cb local_610;
  allocator<char> local_601;
  string local_600;
  anon_class_8_1_55a613f1_for_cb local_5e0;
  allocator<char> local_5d1;
  string local_5d0;
  Sub *local_5b0;
  Sub local_5a8;
  Sub local_4f0;
  iterator local_438;
  size_type local_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_428;
  basic_string_view<char,_std::char_traits<char>_> local_410;
  undefined1 local_3f9;
  anon_class_8_1_55a613f1_for_cb local_3f8;
  allocator<char> local_3e9;
  string local_3e8;
  undefined1 local_3c8 [16];
  string local_3b8;
  undefined8 local_398;
  Sub local_390;
  Sub local_2d8;
  iterator local_220;
  size_type local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_210;
  undefined1 local_200 [80];
  undefined1 local_1b0 [8];
  JvmNameContext name_ctx;
  string local_190;
  string local_170;
  allocator<char> local_139;
  string local_138;
  Sub *local_118;
  Sub local_110;
  iterator local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_48;
  undefined1 local_38 [8];
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  cleanup;
  ClassNameResolver *name_resolver;
  Printer *printer_local;
  FieldGenerator *this_local;
  
  cleanup.storage_.callback_buffer_._8_8_ = java::Context::GetNameResolver(this->context_);
  name_ctx._23_1_ = 1;
  local_118 = &local_110;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"kt_type",&local_139);
  this_00 = cleanup.storage_.callback_buffer_._8_8_;
  descriptor = FieldDescriptor::enum_type(this->descriptor_);
  java::ClassNameResolver::GetImmutableClassName<google::protobuf::EnumDescriptor>
            (&local_190,(ClassNameResolver *)this_00,descriptor);
  java::EscapeKotlinKeywords(&local_170,&local_190);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_110,&local_138,&local_170);
  name_ctx._23_1_ = 0;
  local_58 = &local_110;
  local_50 = 1;
  v_01._M_len = 1;
  v_01._M_array = local_58;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_48._M_local_buf,v_01);
  io::Printer::WithVars
            ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_38,printer,(Span<const_google::protobuf::io::Printer::Sub>)local_48);
  local_720 = (Sub *)&local_58;
  do {
    local_720 = local_720 + -1;
    io::Printer::Sub::~Sub(local_720);
    kdoc = (undefined1)in_R8;
  } while (local_720 != &local_110);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  bVar2 = FieldDescriptor::is_repeated(this->descriptor_);
  if (bVar2) {
    GenerateRepeatedEnumField(this,printer);
    name_ctx.lite = true;
    name_ctx._17_3_ = 0;
  }
  else {
    local_1b0 = (undefined1  [8])java::Context::options(this->context_);
    name_ctx.printer._0_1_ = this->lite_ & 1;
    printer_00 = (Printer *)this->descriptor_;
    name_ctx.options = (Options *)printer;
    pOVar3 = java::Context::options(this->context_);
    java::Options::Options((Options *)local_200,pOVar3);
    java::WriteFieldDocComment
              ((java *)printer,printer_00,(FieldDescriptor *)local_200,(Options *)0x1,(bool)kdoc);
    java::Options::~Options((Options *)local_200);
    local_3f9 = '\x01';
    local_398 = &local_390;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3b8,"jvm_name_get",(allocator<char> *)(local_3c8 + 0xf));
    local_3c8._0_8_ = local_1b0;
    io::Printer::Sub::
    Sub<google::protobuf::compiler::kotlin::FieldGenerator::GenerateEnumField(google::protobuf::io::Printer*)const::__0>
              (&local_390,&local_3b8,(anon_class_8_1_55a613f1_for_cb *)local_3c8);
    local_398 = &local_2d8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e8,"jvm_name_set",&local_3e9);
    local_3f8.name_ctx = (JvmNameContext *)local_1b0;
    io::Printer::Sub::
    Sub<google::protobuf::compiler::kotlin::FieldGenerator::GenerateEnumField(google::protobuf::io::Printer*)const::__1>
              (&local_2d8,&local_3e8,&local_3f8);
    local_3f9 = '\0';
    local_220 = &local_390;
    local_218 = 2;
    v_00._M_len = 2;
    v_00._M_array = local_220;
    absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_210._M_local_buf,v_00);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_410,
               "$kt_deprecation$public var $kt_name$: $kt_type$\n  $jvm_name_get$  get() = $kt_dsl_builder$.${$$kt_safe_name$$}$\n  $jvm_name_set$  set(value) {\n    $kt_dsl_builder$.${$$kt_safe_name$$}$ = value\n  }\n"
              );
    io::Printer::SourceLocation::current();
    io::Printer::Emit(printer,local_210._M_allocated_capacity,local_210._8_8_,local_410._M_len);
    local_7b0 = (Sub *)&local_220;
    do {
      local_7b0 = local_7b0 + -1;
      io::Printer::Sub::~Sub(local_7b0);
    } while (local_7b0 != &local_390);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::allocator<char>::~allocator(&local_3e9);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::allocator<char>::~allocator((allocator<char> *)(local_3c8 + 0xf));
    bVar2 = java::SupportUnknownEnumValue(this->descriptor_);
    if (bVar2) {
      local_611 = 1;
      local_5b0 = &local_5a8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5d0,"jvm_name_get",&local_5d1);
      local_5e0.name_ctx = (JvmNameContext *)local_1b0;
      io::Printer::Sub::
      Sub<google::protobuf::compiler::kotlin::FieldGenerator::GenerateEnumField(google::protobuf::io::Printer*)const::__2>
                (&local_5a8,&local_5d0,&local_5e0);
      local_5b0 = &local_4f0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_600,"jvm_name_set",&local_601);
      local_610.name_ctx = (JvmNameContext *)local_1b0;
      io::Printer::Sub::
      Sub<google::protobuf::compiler::kotlin::FieldGenerator::GenerateEnumField(google::protobuf::io::Printer*)const::__3>
                (&local_4f0,&local_600,&local_610);
      local_611 = 0;
      local_438 = &local_5a8;
      local_430 = 2;
      v._M_len = 2;
      v._M_array = local_438;
      absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
      Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
                ((Span<google::protobuf::io::Printer::Sub_const> *)local_428._M_local_buf,v);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_628,
                 "$kt_deprecation$public var $kt_name$Value: kotlin.Int\n  $jvm_name_get$  get() = $kt_dsl_builder$.${$$kt_property_name$Value$}$\n  $jvm_name_set$  set(value) {\n    $kt_dsl_builder$.${$$kt_property_name$Value$}$ = value\n  }\n"
                );
      io::Printer::SourceLocation::current();
      io::Printer::Emit(printer,local_428._M_allocated_capacity,local_428._8_8_,local_628._M_len);
      local_7f0 = (Sub *)&local_438;
      do {
        local_7f0 = local_7f0 + -1;
        io::Printer::Sub::~Sub(local_7f0);
      } while (local_7f0 != &local_5a8);
      std::__cxx11::string::~string((string *)&local_600);
      std::allocator<char>::~allocator(&local_601);
      std::__cxx11::string::~string((string *)&local_5d0);
      std::allocator<char>::~allocator(&local_5d1);
    }
    pFVar1 = this->descriptor_;
    pOVar3 = java::Context::options(this->context_);
    java::Options::Options(&local_680,pOVar3);
    java::WriteFieldAccessorDocComment(printer,pFVar1,CLEARER,&local_680,false,true,false);
    java::Options::~Options(&local_680);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_690,
               "public fun ${$clear$kt_capitalized_name$$}$() {\n  $kt_dsl_builder$.${$clear$capitalized_name$$}$()\n}\n"
              );
    io::Printer::Print<>(printer,local_690);
    bVar2 = FieldDescriptor::has_presence(this->descriptor_);
    if (bVar2) {
      pFVar1 = this->descriptor_;
      pOVar3 = java::Context::options(this->context_);
      java::Options::Options(&local_6e0,pOVar3);
      java::WriteFieldAccessorDocComment(printer,pFVar1,HAZZER,&local_6e0,false,true,false);
      java::Options::~Options(&local_6e0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_6f0,
                 "public fun ${$has$kt_capitalized_name$$}$(): kotlin.Boolean {\n  return $kt_dsl_builder$.${$has$capitalized_name$$}$()\n}\n"
                );
      io::Printer::Print<>(printer,local_6f0);
    }
    name_ctx.lite = false;
    name_ctx._17_3_ = 0;
  }
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_38);
  return;
}

Assistant:

void FieldGenerator::GenerateEnumField(io::Printer* printer) const {
  auto name_resolver = context_->GetNameResolver();
  auto cleanup = printer->WithVars(
      {{"kt_type",
        java::EscapeKotlinKeywords(
            name_resolver->GetImmutableClassName(descriptor_->enum_type()))}});

  if (descriptor_->is_repeated()) {
    GenerateRepeatedEnumField(printer);
    return;
  }

  java::JvmNameContext name_ctx = {context_->options(), printer, lite_};
  WriteFieldDocComment(printer, descriptor_, context_->options(),
                       /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name_get",
           [&] { JvmName("${$get$kt_capitalized_name$$}$", name_ctx); }},
          {"jvm_name_set",
           [&] { JvmName("${$set$kt_capitalized_name$$}$", name_ctx); }},
      },
      "$kt_deprecation$public var $kt_name$: $kt_type$\n"
      "  $jvm_name_get$"
      "  get() = $kt_dsl_builder$.${$$kt_safe_name$$}$\n"
      "  $jvm_name_set$"
      "  set(value) {\n"
      "    $kt_dsl_builder$.${$$kt_safe_name$$}$ = value\n"
      "  }\n");

  if (java::SupportUnknownEnumValue(descriptor_)) {
    printer->Emit(
        {
            {"jvm_name_get",
             [&] { JvmName("${$get$kt_capitalized_name$Value$}$", name_ctx); }},
            {"jvm_name_set",
             [&] { JvmName("${$set$kt_capitalized_name$Value$}$", name_ctx); }},
        },
        "$kt_deprecation$public var $kt_name$Value: kotlin.Int\n"
        "  $jvm_name_get$"
        "  get() = $kt_dsl_builder$.${$$kt_property_name$Value$}$\n"
        "  $jvm_name_set$"
        "  set(value) {\n"
        "    $kt_dsl_builder$.${$$kt_property_name$Value$}$ = value\n"
        "  }\n");
  }

  WriteFieldAccessorDocComment(printer, descriptor_, java::CLEARER,
                               context_->options(),
                               /* builder */ false, /* kdoc */ true);
  printer->Print(
      "public fun ${$clear$kt_capitalized_name$$}$() {\n"
      "  $kt_dsl_builder$.${$clear$capitalized_name$$}$()\n"
      "}\n");

  if (descriptor_->has_presence()) {
    WriteFieldAccessorDocComment(printer, descriptor_, java::HAZZER,
                                 context_->options(),
                                 /* builder */ false, /* kdoc */ true);
    printer->Print(
        "public fun ${$has$kt_capitalized_name$$}$(): kotlin.Boolean {\n"
        "  return $kt_dsl_builder$.${$has$capitalized_name$$}$()\n"
        "}\n");
  }
}